

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

BOOL MayHaveSideEffectOnNode
               (ParseNode *pnode,ParseNode *pnodeSE,ByteCodeGenerator *byteCodeGenerator)

{
  OpCode OVar1;
  uint uVar2;
  ParseNodeUni *pPVar3;
  ParseNode *this;
  ParseNodeBin *pPVar4;
  ParseNodeCall *pPVar5;
  ParseNodePtr *data;
  ParseNodeTri *pPVar6;
  BOOL BVar7;
  undefined1 local_40 [8];
  SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> pNodeSEStack;
  ParseNode *pnodeSE_local;
  
  OVar1 = pnode->nop;
  pNodeSEStack.allocator = (Type)pnodeSE;
  if (OVar1 == knopComputedName) {
    pPVar3 = ParseNode::AsParseNodeUni(pnode);
    OVar1 = pPVar3->pnode1->nop;
  }
  BVar7 = 0;
  if (OVar1 == knopName) {
    pNodeSEStack.super_SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>._8_8_ =
         byteCodeGenerator->alloc;
    pNodeSEStack.super_SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>.
    super_SListNodeBase<Memory::ArenaAllocator>.next._0_4_ = 0;
    local_40 = (undefined1  [8])local_40;
    SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::Prepend
              ((SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)local_40,
               (ParseNode **)&pNodeSEStack.allocator);
    BVar7 = 1;
LAB_0075572e:
    do {
      while( true ) {
        do {
          if (local_40 == (undefined1  [8])local_40) {
            BVar7 = 0;
            goto LAB_00755856;
          }
          this = SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::Pop
                           ((SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)local_40);
          uVar2 = ParseNode::Grfnop((uint)this->nop);
        } while ((uVar2 & 2) != 0);
        if ((uVar2 & 0x20) != 0) goto LAB_00755856;
        if ((uVar2 & 4) == 0) break;
        if ((this->nop != knopTempRef) &&
           (pPVar3 = ParseNode::AsParseNodeUni(this), pPVar3->pnode1 != (ParseNodePtr)0x0)) {
          pPVar3 = ParseNode::AsParseNodeUni(this);
          data = &pPVar3->pnode1;
LAB_0075580d:
          SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::Prepend
                    ((SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)local_40,data);
        }
      }
      if ((uVar2 & 8) != 0) {
        pPVar4 = ParseNode::AsParseNodeBin(this);
        SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::Prepend
                  ((SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)local_40,&pPVar4->pnode1
                  );
        pPVar4 = ParseNode::AsParseNodeBin(this);
        if (pPVar4->pnode2 != (ParseNodePtr)0x0) {
          pPVar5 = (ParseNodeCall *)ParseNode::AsParseNodeBin(this);
LAB_00755809:
          data = &pPVar5->pnodeArgs;
          goto LAB_0075580d;
        }
        goto LAB_0075572e;
      }
      OVar1 = this->nop;
      if ((OVar1 == knopCall) || (OVar1 == knopNew)) {
        pPVar5 = ParseNode::AsParseNodeCall(this);
        SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::Prepend
                  ((SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)local_40,
                   &pPVar5->pnodeTarget);
        pPVar5 = ParseNode::AsParseNodeCall(this);
        if (pPVar5->pnodeArgs != (ParseNodePtr)0x0) {
          pPVar5 = ParseNode::AsParseNodeCall(this);
          goto LAB_00755809;
        }
        goto LAB_0075572e;
      }
      if (OVar1 == knopQmark) {
        pPVar6 = ParseNode::AsParseNodeTri(this);
        SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::Prepend
                  ((SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)local_40,&pPVar6->pnode1
                  );
        SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::Prepend
                  ((SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)local_40,&pPVar6->pnode2
                  );
        SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::Prepend
                  ((SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)local_40,&pPVar6->pnode3
                  );
        goto LAB_0075572e;
      }
    } while (OVar1 != knopList);
LAB_00755856:
    SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::~SList
              ((SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)local_40);
  }
  return BVar7;
}

Assistant:

BOOL MayHaveSideEffectOnNode(ParseNode *pnode, ParseNode *pnodeSE, ByteCodeGenerator *byteCodeGenerator)
{
    // Try to determine whether pnodeSE (SE = side effect) may kill the named var represented by pnode.

    if (pnode->nop == knopComputedName)
    {
        pnode = pnode->AsParseNodeUni()->pnode1;
    }

    if (pnode->nop != knopName)
    {
        // Only investigating named vars here.
        return false;
    }

    ArenaAllocator *alloc = byteCodeGenerator->GetAllocator();
    SList<ParseNode*> pNodeSEStack(alloc);

    pNodeSEStack.Push(pnodeSE);

    // A pnodeSE can have children that can cause a side effect on pnode. A stack is used to check
    // pnodeSE and all potential pnodeSE children that could cause a side effect on pnode. When a
    // child pnodeSE can cause a side effect on pnode, immediately return true. Otherwise continue
    // checking children of pnodeSE until none exist
    while (!pNodeSEStack.Empty())
    {
        ParseNode *currPnodeSE = pNodeSEStack.Pop();
        uint fnop = ParseNode::Grfnop(currPnodeSE->nop);

        if (fnop & fnopLeaf)
        {
            // pnodeSE is a leaf and can't kill anything.
            continue;
        }
        else if (fnop & fnopAsg)
        {
            // pnodeSE is an assignment (=, ++, +=, etc.)
            // Trying to examine the LHS of pnodeSE caused small perf regressions,
            // maybe because of code layout or some other subtle effect.
            return true;
        }
        else if (fnop & fnopUni)
        {
            // pnodeSE is a unary op, so recurse to the source (if present - e.g., [] may have no opnd).
            if (currPnodeSE->nop == knopTempRef)
            {
                continue;
            }
            else if (currPnodeSE->AsParseNodeUni()->pnode1)
            {
                pNodeSEStack.Push(currPnodeSE->AsParseNodeUni()->pnode1);
            }
        }
        else if (fnop & fnopBin)
        {
            // currPnodeSE is a binary (or ternary) op, so check sources (if present).

            pNodeSEStack.Push(currPnodeSE->AsParseNodeBin()->pnode1);
            
            if (currPnodeSE->AsParseNodeBin()->pnode2)
            {
                pNodeSEStack.Push(currPnodeSE->AsParseNodeBin()->pnode2);
            }
        }
        else if (currPnodeSE->nop == knopQmark)
        {
            ParseNodeTri * pnodeTriSE = currPnodeSE->AsParseNodeTri();

            pNodeSEStack.Push(pnodeTriSE->pnode1);
            pNodeSEStack.Push(pnodeTriSE->pnode2);
            pNodeSEStack.Push(pnodeTriSE->pnode3);
        }
        else if (currPnodeSE->nop == knopCall || currPnodeSE->nop == knopNew)
        {
            pNodeSEStack.Push(currPnodeSE->AsParseNodeCall()->pnodeTarget);

            if (currPnodeSE->AsParseNodeCall()->pnodeArgs)
            {
                pNodeSEStack.Push(currPnodeSE->AsParseNodeCall()->pnodeArgs);
            }
        }
        else if (currPnodeSE->nop == knopList)
        {
            return true;
        }
    }

    return false;
}